

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Solver.cc
# Opt level: O3

void __thiscall Minisat::Solver::toDimacs(Solver *this,FILE *f,vec<Minisat::Lit,_int> *assumps)

{
  byte bVar1;
  uint uVar2;
  uint *puVar3;
  uint *puVar4;
  FILE *f_00;
  bool bVar5;
  Clause CVar6;
  Var_conflict VVar7;
  char *pcVar8;
  long lVar9;
  int iVar10;
  uint uVar11;
  int iVar12;
  anon_struct_4_5_613047fb_for_header *c;
  ulong uVar13;
  ulong uVar14;
  Var_conflict max;
  uint local_5c;
  vec<int,_int> local_58;
  FILE *local_40;
  vec<Minisat::Lit,_int> *local_38;
  
  if (this->ok == false) {
    fwrite("p cnf 1 2\n1 0\n-1 0\n",0x13,1,(FILE *)f);
    return;
  }
  local_58.data = (int *)0x0;
  local_58.sz = 0;
  local_58.cap = 0;
  local_5c = 0;
  iVar12 = (this->clauses).sz;
  uVar13 = (ulong)iVar12;
  local_40 = (FILE *)f;
  if ((long)uVar13 < 1) {
    iVar10 = 0;
  }
  else {
    puVar3 = (this->clauses).data;
    puVar4 = (this->ca).ra.memory;
    uVar14 = 0;
    iVar10 = 0;
    local_38 = assumps;
    do {
      bVar5 = satisfied(this,(Clause *)(puVar4 + puVar3[uVar14]));
      assumps = local_38;
      iVar10 = iVar10 + (uint)!bVar5;
      uVar14 = uVar14 + 1;
    } while (uVar13 != uVar14);
    if (0 < iVar12) {
      lVar9 = 0;
      do {
        c = (anon_struct_4_5_613047fb_for_header *)
            ((this->ca).ra.memory + (this->clauses).data[lVar9]);
        bVar5 = satisfied(this,(Clause *)c);
        if ((!bVar5) && (CVar6.header = *c, 0x1f < (uint)CVar6.header)) {
          uVar13 = 0;
          do {
            iVar12 = (int)c[uVar13 + 1] >> 1;
            bVar1 = (this->assigns).super_IntMap<int,_Minisat::lbool,_Minisat::MkIndexDefault<int>_>
                    .map.data[iVar12].value;
            if (((SUB41(c[uVar13 + 1],0) & 1 ^ bVar1) != l_False || (l_False & 2) != 0) &&
                (l_False & 2 & bVar1) == 0) {
              mapVar(iVar12,&local_58,(Var_conflict *)&local_5c);
              CVar6.header = *c;
            }
            uVar13 = uVar13 + 1;
          } while (uVar13 < (uint)CVar6.header >> 5);
          uVar13 = (ulong)(uint)(this->clauses).sz;
        }
        lVar9 = lVar9 + 1;
      } while (lVar9 < (int)uVar13);
      uVar13 = (ulong)local_5c;
      goto LAB_00610f69;
    }
  }
  uVar13 = 0;
LAB_00610f69:
  uVar11 = iVar10 + assumps->sz;
  fprintf(local_40,"p cnf %d %d\n",uVar13,(ulong)uVar11);
  if (0 < assumps->sz) {
    lVar9 = 0;
    do {
      uVar2 = assumps->data[lVar9].x;
      VVar7 = mapVar((int)uVar2 >> 1,&local_58,(Var_conflict *)&local_5c);
      pcVar8 = "-";
      if ((uVar2 & 1) == 0) {
        pcVar8 = "";
      }
      fprintf(local_40,"%s%d 0\n",pcVar8,(ulong)(VVar7 + 1));
      lVar9 = lVar9 + 1;
    } while (lVar9 < assumps->sz);
  }
  f_00 = local_40;
  if (0 < (this->clauses).sz) {
    lVar9 = 0;
    do {
      toDimacs(this,(FILE *)f_00,(Clause *)((this->ca).ra.memory + (this->clauses).data[lVar9]),
               &local_58,(Var_conflict *)&local_5c);
      lVar9 = lVar9 + 1;
    } while (lVar9 < (this->clauses).sz);
  }
  if (0 < this->verbosity) {
    printf("Wrote DIMACS with %d variables and %d clauses.\n",(ulong)local_5c,(ulong)uVar11);
  }
  if (local_58.data != (int *)0x0) {
    local_58._8_8_ = local_58._8_8_ & 0xffffffff00000000;
    free(local_58.data);
  }
  return;
}

Assistant:

void Solver::toDimacs(FILE* f, const vec<Lit>& assumps)
{
    // Handle case when solver is in contradictory state:
    if (!ok){
        fprintf(f, "p cnf 1 2\n1 0\n-1 0\n");
        return; }

    vec<Var> map; Var max = 0;

    // Cannot use removeClauses here because it is not safe
    // to deallocate them at this point. Could be improved.
    int cnt = 0;
    for (int i = 0; i < clauses.size(); i++)
        if (!satisfied(ca[clauses[i]]))
            cnt++;
        
    for (int i = 0; i < clauses.size(); i++)
        if (!satisfied(ca[clauses[i]])){
            Clause& c = ca[clauses[i]];
            for (int j = 0; j < c.size(); j++)
                if (value(c[j]) != l_False)
                    mapVar(var(c[j]), map, max);
        }

    // Assumptions are added as unit clauses:
    cnt += assumps.size();

    fprintf(f, "p cnf %d %d\n", max, cnt);

    for (int i = 0; i < assumps.size(); i++){
        assert(value(assumps[i]) != l_False);
        fprintf(f, "%s%d 0\n", sign(assumps[i]) ? "-" : "", mapVar(var(assumps[i]), map, max)+1);
    }

    for (int i = 0; i < clauses.size(); i++)
        toDimacs(f, ca[clauses[i]], map, max);

    if (verbosity > 0)
        printf("Wrote DIMACS with %d variables and %d clauses.\n", max, cnt);
}